

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_class.cpp
# Opt level: O2

void Omega_h::classify_sides_by_exposure(Mesh *mesh,Read<signed_char> *side_is_exposed)

{
  Int IVar1;
  uint size_in;
  ulong uVar2;
  undefined1 auStack_d8 [32];
  long local_b8;
  Write<signed_char> class_dim;
  Write<signed_char> local_a0;
  Write<signed_char> local_90;
  Write<signed_char> local_80;
  Int local_70;
  Write<signed_char> local_68;
  type f;
  
  IVar1 = Mesh::dim(mesh);
  size_in = Mesh::nents(mesh,IVar1 + -1);
  std::__cxx11::string::string((string *)auStack_d8,"",(allocator *)&local_80);
  Write<signed_char>::Write(&class_dim,size_in,(string *)auStack_d8);
  std::__cxx11::string::~string((string *)auStack_d8);
  Write<signed_char>::Write(&f.class_dim,&class_dim);
  f.dim = IVar1;
  Write<signed_char>::Write(&f.side_is_exposed.write_,&side_is_exposed->write_);
  Write<signed_char>::Write(&local_80,&f.class_dim);
  local_70 = f.dim;
  Write<signed_char>::Write(&local_68,&f.side_is_exposed.write_);
  if (0 < (int)size_in) {
    entering_parallel = 1;
    Write<signed_char>::Write((Write<signed_char> *)auStack_d8,&local_80);
    auStack_d8._16_4_ = local_70;
    Write<signed_char>::Write((Write<signed_char> *)(auStack_d8 + 0x18),&local_68);
    entering_parallel = 0;
    for (uVar2 = 0; size_in != uVar2; uVar2 = uVar2 + 1) {
      *(char *)(auStack_d8._8_8_ + uVar2) = auStack_d8[0x10] - *(char *)(local_b8 + uVar2);
    }
    classify_sides_by_exposure(Omega_h::Mesh*,Omega_h::Read<signed_char>)::$_0::~__0
              ((__0 *)auStack_d8);
  }
  classify_sides_by_exposure(Omega_h::Mesh*,Omega_h::Read<signed_char>)::$_0::~__0((__0 *)&local_80)
  ;
  std::__cxx11::string::string((string *)auStack_d8,"class_dim",(allocator *)&local_80);
  Write<signed_char>::Write(&local_a0,&class_dim);
  Read<signed_char>::Read((Read<signed_char> *)&local_90,&local_a0);
  Mesh::add_tag<signed_char>
            (mesh,IVar1 + -1,(string *)auStack_d8,1,(Read<signed_char> *)&local_90,false);
  Write<signed_char>::~Write(&local_90);
  Write<signed_char>::~Write(&local_a0);
  std::__cxx11::string::~string((string *)auStack_d8);
  classify_sides_by_exposure(Omega_h::Mesh*,Omega_h::Read<signed_char>)::$_0::~__0((__0 *)&f);
  Write<signed_char>::~Write(&class_dim);
  return;
}

Assistant:

void classify_sides_by_exposure(Mesh* mesh, Read<I8> side_is_exposed) {
  auto dim = mesh->dim();
  auto ns = mesh->nents(dim - 1);
  Write<I8> class_dim(ns);
  auto f = OMEGA_H_LAMBDA(LO s) {
    class_dim[s] = static_cast<I8>(dim - side_is_exposed[s]);
  };
  parallel_for(ns, f, "classify_sides_by_exposure");
  mesh->add_tag<I8>(dim - 1, "class_dim", 1, class_dim);
}